

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

LaneArray<16> * __thiscall
wasm::getLanes<unsigned_char,16>(LaneArray<16> *__return_storage_ptr__,wasm *this,Literal *val)

{
  LaneArray<16> *extraout_RAX;
  long lVar1;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  undefined1 local_38 [8];
  array<unsigned_char,_16UL> bytes;
  
  if (*(long *)(this + 0x10) == 6) {
    _local_38 = Literal::getv128((Literal *)this);
    lVar1 = 0;
    memset(__return_storage_ptr__,0,0x180);
    do {
      local_50.i32 = (int32_t)(byte)local_38[lVar1];
      local_40 = 2;
      if ((anon_union_16_5_9943fe1e_for_Literal_0 *)__return_storage_ptr__ != &local_50) {
        Literal::~Literal(__return_storage_ptr__->_M_elems);
        Literal::Literal(__return_storage_ptr__->_M_elems,(Literal *)&local_50.func);
      }
      Literal::~Literal((Literal *)&local_50.func);
      lVar1 = lVar1 + 1;
      __return_storage_ptr__ = (LaneArray<16> *)((long)__return_storage_ptr__ + 0x18);
    } while (lVar1 != 0x10);
    return extraout_RAX;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,
                "LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = unsigned char, Lanes = 16]"
               );
}

Assistant:

static LaneArray<Lanes> getLanes(const Literal& val) {
  assert(val.type == Type::v128);
  const size_t lane_width = 16 / Lanes;
  std::array<uint8_t, 16> bytes = val.getv128();
  LaneArray<Lanes> lanes;
  for (size_t lane_index = 0; lane_index < Lanes; ++lane_index) {
    LaneT lane(0);
    for (size_t offset = 0; offset < lane_width; ++offset) {
      lane |= LaneT(bytes.at(lane_index * lane_width + offset))
              << LaneT(8 * offset);
    }
    lanes.at(lane_index) = Literal(lane);
  }
  return lanes;
}